

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O0

int __thiscall CommandLineTestRunner::runAllTestsMain(CommandLineTestRunner *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CommandLineTestRunner *in_RDI;
  SetPointerPlugin pPlugin;
  int testResult;
  CommandLineTestRunner *in_stack_00000128;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SimpleString *in_stack_ffffffffffffff70;
  TestRegistry *this_00;
  undefined1 local_68 [48];
  undefined1 local_38 [44];
  int local_c;
  
  local_c = 1;
  SimpleString::SimpleString
            (in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SetPointerPlugin::SetPointerPlugin
            ((SetPointerPlugin *)in_stack_ffffffffffffff70,
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SimpleString::~SimpleString((SimpleString *)0x16f788);
  (*in_RDI->registry_->_vptr_TestRegistry[0xc])(in_RDI->registry_,local_38);
  iVar2 = (*in_RDI->registry_->_vptr_TestRegistry[0xe])();
  bVar1 = parseArguments(in_RDI,(TestPlugin *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    local_c = runAllTests(in_stack_00000128);
  }
  this_00 = in_RDI->registry_;
  SimpleString::SimpleString
            ((SimpleString *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  (*this_00->_vptr_TestRegistry[0x10])(this_00,local_68);
  SimpleString::~SimpleString((SimpleString *)0x16f866);
  SetPointerPlugin::~SetPointerPlugin((SetPointerPlugin *)0x16f87b);
  return local_c;
}

Assistant:

int CommandLineTestRunner::runAllTestsMain()
{
    int testResult = 1;

    SetPointerPlugin pPlugin(DEF_PLUGIN_SET_POINTER);
    registry_->installPlugin(&pPlugin);

    if (parseArguments(registry_->getFirstPlugin()))
        testResult = runAllTests();

    registry_->removePluginByName(DEF_PLUGIN_SET_POINTER);
    return testResult;
}